

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O3

ksymbol_t KHashMap_getcode(KonohaContext *kctx,KHashMap *kmp,kArray *list,char *name,size_t len,
                          uintptr_t hcode,int spol,ksymbol_t def)

{
  int iVar1;
  KHashMapEntry *pKVar2;
  char *__s1;
  kString *pkVar3;
  ulong uVar4;
  
  pKVar2 = (*kctx->klib->KHashMap_get)(kctx,kmp,hcode);
  do {
    if (pKVar2 == (KHashMapEntry *)0x0) {
      uVar4 = (ulong)def;
      if (def == 0xfffffffe) {
        uVar4 = list->bytesize >> 3;
        pkVar3 = (*kctx->klib->new_kString)(kctx,list,name,len,spol);
        pKVar2 = (*kctx->klib->KHashMap_newEntry)(kctx,kmp,hcode);
        (pKVar2->field_2).StringKey = pkVar3;
        (pKVar2->field_3).unboxValue = uVar4;
      }
LAB_00105953:
      return (ksymbol_t)uVar4;
    }
    if ((pKVar2->hcode == hcode) &&
       (pkVar3 = (pKVar2->field_2).StringKey,
       ((anon_union_40_2_bc227064_for_kObjectVar_1 *)&pkVar3->bytesize)->fieldObjectItems[0] ==
       (kObject *)len)) {
      __s1 = (char *)(*((pkVar3->h).ct)->unbox)(kctx,(kObject_conflict *)pkVar3);
      iVar1 = strncmp(__s1,name,len);
      if (iVar1 == 0) {
        uVar4 = (ulong)*(uint *)&pKVar2->field_3;
        goto LAB_00105953;
      }
    }
    pKVar2 = pKVar2->next;
  } while( true );
}

Assistant:

static ksymbol_t KHashMap_getcode(KonohaContext *kctx, KHashMap *kmp, kArray *list, const char *name, size_t len, uintptr_t hcode, int spol, ksymbol_t def)
{
	KHashMapEntry *e = KLIB KHashMap_get(kctx, kmp, hcode);
	while(e != NULL) {
		if(e->hcode == hcode && len == kString_size(e->StringKey) && strncmp(kString_text(e->StringKey), name, len) == 0) {
			return (ksymbol_t)e->unboxValue;
		}
		e = e->next;
	}
	if(def == KSymbol_NewId) {
		uintptr_t sym = kArray_size(list);
		kString *stringKey = KLIB new_kString(kctx, list, name, len, spol);
		KHashMap_AddStringUnboxValue(kctx, kmp, hcode, stringKey, sym);
		return (ksymbol_t)sym;
	}
	return def;
}